

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O1

DecodePsbtOutputStruct * __thiscall
cfd::api::json::DecodePsbtOutput::ConvertToStruct
          (DecodePsbtOutputStruct *__return_storage_ptr__,DecodePsbtOutput *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> local_e8;
  undefined1 local_c8 [32];
  _Alloc_hider local_a8;
  char local_98 [16];
  _Alloc_hider local_88;
  char local_78 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  
  (__return_storage_ptr__->redeem_script).asm_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->redeem_script).asm_.field_2;
  (__return_storage_ptr__->redeem_script).asm_._M_string_length = 0;
  (__return_storage_ptr__->redeem_script).asm_.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->redeem_script).hex._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->redeem_script).hex.field_2;
  (__return_storage_ptr__->redeem_script).hex._M_string_length = 0;
  (__return_storage_ptr__->redeem_script).hex.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->redeem_script).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->redeem_script).type.field_2;
  (__return_storage_ptr__->redeem_script).type._M_string_length = 0;
  (__return_storage_ptr__->redeem_script).type.field_2._M_local_buf[0] = '\0';
  p_Var3 = &(__return_storage_ptr__->redeem_script).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->redeem_script).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (__return_storage_ptr__->redeem_script).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->redeem_script).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var3->_M_header;
  (__return_storage_ptr__->redeem_script).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var3->_M_header;
  (__return_storage_ptr__->redeem_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (__return_storage_ptr__->witness_script).asm_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->witness_script).asm_.field_2;
  (__return_storage_ptr__->witness_script).asm_._M_string_length = 0;
  (__return_storage_ptr__->witness_script).asm_.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->witness_script).hex._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->witness_script).hex.field_2;
  (__return_storage_ptr__->witness_script).hex._M_string_length = 0;
  (__return_storage_ptr__->witness_script).hex.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->witness_script).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->witness_script).type.field_2;
  (__return_storage_ptr__->witness_script).type._M_string_length = 0;
  (__return_storage_ptr__->witness_script).type.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->witness_script).ignore_items._M_t._M_impl.super__Rb_tree_header
  ;
  (__return_storage_ptr__->witness_script).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header
  ._M_color = _S_red;
  (__return_storage_ptr__->witness_script).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header
  ._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->witness_script).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header
  ._M_left = &p_Var1->_M_header;
  (__return_storage_ptr__->witness_script).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header
  ._M_right = &p_Var1->_M_header;
  p_Var2 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->unknown).
  super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->unknown).
  super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->unknown).
  super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->bip32_derivs).
  super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->bip32_derivs).
  super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->witness_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (__return_storage_ptr__->bip32_derivs).
  super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  PsbtScriptData::ConvertToStruct((PsbtScriptDataStruct *)local_c8,&this->redeem_script_);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_c8);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->redeem_script).hex,(string *)&local_a8);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->redeem_script).type,(string *)&local_88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->redeem_script).ignore_items._M_t);
  if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &local_68._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->redeem_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = local_68._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->redeem_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_parent = local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->redeem_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_left = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->redeem_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_right = local_68._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_68._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var3->_M_header;
    (__return_storage_ptr__->redeem_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = local_68._M_impl.super__Rb_tree_header._M_node_count;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_68);
  if (local_88._M_p != local_78) {
    operator_delete(local_88._M_p);
  }
  if (local_a8._M_p != local_98) {
    operator_delete(local_a8._M_p);
  }
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_);
  }
  PsbtScriptData::ConvertToStruct((PsbtScriptDataStruct *)local_c8,&this->witness_script_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->witness_script,(string *)local_c8);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->witness_script).hex,(string *)&local_a8);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->witness_script).type,(string *)&local_88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->witness_script).ignore_items._M_t);
  if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var3 = &local_68._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->witness_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = local_68._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->witness_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_parent = local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->witness_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_left = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->witness_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_right = local_68._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_68._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (__return_storage_ptr__->witness_script).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = local_68._M_impl.super__Rb_tree_header._M_node_count;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_68);
  if (local_88._M_p != local_78) {
    operator_delete(local_88._M_p);
  }
  if (local_a8._M_p != local_98) {
    operator_delete(local_a8._M_p);
  }
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_);
  }
  core::JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct>::ConvertToStruct
            (&local_e8,&this->bip32_derivs_);
  local_c8._0_8_ =
       (__return_storage_ptr__->bip32_derivs).
       super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_c8._8_8_ =
       (__return_storage_ptr__->bip32_derivs).
       super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_c8._16_8_ =
       (__return_storage_ptr__->bip32_derivs).
       super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->bip32_derivs).
  super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_e8.super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->bip32_derivs).
  super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_e8.super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->bip32_derivs).
  super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_e8.super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_e8.super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>::~vector
            ((vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *)local_c8);
  std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>::~vector(&local_e8);
  core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::ConvertToStruct
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)&local_e8,
             &this->unknown_);
  local_c8._0_8_ =
       (__return_storage_ptr__->unknown).
       super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_c8._8_8_ =
       (__return_storage_ptr__->unknown).
       super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_c8._16_8_ =
       (__return_storage_ptr__->unknown).
       super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->unknown).
  super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_e8.
                super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->unknown).
  super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_e8.
                super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->unknown).
  super__Vector_base<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_e8.
                super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_e8.super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::~vector
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)local_c8);
  std::vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_>::~vector
            ((vector<PsbtMapDataStruct,_std::allocator<PsbtMapDataStruct>_> *)&local_e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

DecodePsbtOutputStruct DecodePsbtOutput::ConvertToStruct() const {  // NOLINT
  DecodePsbtOutputStruct result;
  result.redeem_script = redeem_script_.ConvertToStruct();
  result.witness_script = witness_script_.ConvertToStruct();
  result.bip32_derivs = bip32_derivs_.ConvertToStruct();
  result.unknown = unknown_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}